

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

Template * __thiscall
inja::Parser::parse_template(Template *__return_storage_ptr__,Parser *this,string_view filename)

{
  ParserConfig *parser_config;
  string_view path_00;
  string_view filename_00;
  size_type sVar1;
  LexerConfig *lexer_config;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  Parser local_138;
  const_pointer pcStack_88;
  string_view path;
  string local_50;
  undefined1 local_29;
  Parser *local_28;
  Parser *this_local;
  string_view filename_local;
  Template *result;
  
  filename_local.data_ = (const_pointer)filename.size_;
  this_local = (Parser *)filename.data_;
  local_29 = 0;
  local_28 = this;
  filename_local.size_ = (size_type)__return_storage_ptr__;
  Template::Template(__return_storage_ptr__);
  filename_00.size_ = (size_type)filename_local.data_;
  filename_00.data_ = (const_pointer)this_local;
  load_file_abi_cxx11_(&local_50,this,filename_00);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->content,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  sVar1 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,"/\\",
                     0xffffffffffffffff);
  bVar2 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,0,sVar1 + 1);
  path.data_ = (const_pointer)bVar2.size_;
  pcStack_88 = bVar2.data_;
  parser_config = this->m_config;
  lexer_config = Lexer::get_config(&this->m_lexer);
  Parser(&local_138,parser_config,lexer_config,this->m_included_templates);
  path_00.size_ = (size_type)path.data_;
  path_00.data_ = pcStack_88;
  parse_into(&local_138,__return_storage_ptr__,path_00);
  ~Parser(&local_138);
  return __return_storage_ptr__;
}

Assistant:

Template parse_template(nonstd::string_view filename) {
		Template result;
		result.content = load_file(filename);

		nonstd::string_view path = filename.substr(0, filename.find_last_of("/\\") + 1);
		// StringRef path = sys::path::parent_path(filename);
		Parser(m_config, m_lexer.get_config(), m_included_templates).parse_into(result, path);
		return result;
	}